

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void __thiscall
Units_isCompatibleBaseUnitImported_Test::TestBody(Units_isCompatibleBaseUnitImported_Test *this)

{
  element_type *peVar1;
  element_type *peVar2;
  byte bVar3;
  allocator<char> local_b0 [8];
  AssertHelper local_a8 [8];
  char *local_a0 [4];
  UnitsPtr u2;
  ImportSourcePtr import;
  AssertionResult gtest_ar_;
  UnitsPtr u1;
  UnitsPtr u;
  ModelPtr model;
  
  libcellml::Model::create();
  peVar2 = model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,"model",(allocator<char> *)&import);
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string((string *)local_a0);
  libcellml::Units::create();
  peVar1 = u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,"u",(allocator<char> *)&import);
  libcellml::NamedEntity::setName((string *)peVar1);
  std::__cxx11::string::~string((string *)local_a0);
  peVar1 = u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,"apples",(allocator<char> *)&u1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&import,"",(allocator<char> *)&u2);
  libcellml::Units::addUnit((string *)peVar1,(int)local_a0,1.0,1.0,(string *)0x0);
  std::__cxx11::string::~string((string *)&import);
  std::__cxx11::string::~string((string *)local_a0);
  libcellml::Units::create();
  peVar1 = u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,"u1",(allocator<char> *)&import);
  libcellml::NamedEntity::setName((string *)peVar1);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,"",(allocator<char> *)&import);
  libcellml::Units::addUnit
            ((StandardUnit)
             u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0x16,1.0,1.0
             ,(string *)0x0);
  std::__cxx11::string::~string((string *)local_a0);
  libcellml::Units::create();
  peVar1 = u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,"u2",(allocator<char> *)&import);
  libcellml::NamedEntity::setName((string *)peVar1);
  std::__cxx11::string::~string((string *)local_a0);
  peVar1 = u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,"",(allocator<char> *)&import);
  libcellml::Units::addUnit((StandardUnit)peVar1,0x16,1.0,1.0,(string *)0x0);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,"u",(allocator<char> *)&gtest_ar_);
  std::__cxx11::string::string<std::allocator<char>>((string *)&import,"",local_b0);
  libcellml::Units::addUnit
            ((string *)u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (int)local_a0,1.0,1.0,(string *)0x0);
  std::__cxx11::string::~string((string *)&import);
  std::__cxx11::string::~string((string *)local_a0);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::ImportSource::create();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,"I_am_a_url",(allocator<char> *)&gtest_ar_);
  libcellml::ImportSource::setUrl
            ((string *)
             import.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)local_a0);
  libcellml::ImportedEntity::setImportSource
            ((shared_ptr *)
             (u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x10));
  gtest_ar_.success_ = (bool)libcellml::ImportedEntity::isImport();
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_a0,&gtest_ar_.success_,"u->isImport()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x75a,local_a0[0]);
    testing::internal::AssertHelper::operator=(local_a8,(Message *)local_b0);
    testing::internal::AssertHelper::~AssertHelper(local_a8);
    std::__cxx11::string::~string((string *)local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_b0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  bVar3 = libcellml::Units::compatible((shared_ptr *)&u1,(shared_ptr *)&u2);
  gtest_ar_.success_ = (bool)(bVar3 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar3 != 0) {
    testing::Message::Message((Message *)local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_a0,&gtest_ar_.success_,
               "libcellml::Units::compatible(u1, u2)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x75b,local_a0[0]);
    testing::internal::AssertHelper::operator=(local_a8,(Message *)local_b0);
    testing::internal::AssertHelper::~AssertHelper(local_a8);
    std::__cxx11::string::~string((string *)local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_b0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  bVar3 = libcellml::Units::compatible((shared_ptr *)&u2,(shared_ptr *)&u1);
  gtest_ar_.success_ = (bool)(bVar3 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar3 != 0) {
    testing::Message::Message((Message *)local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_a0,&gtest_ar_.success_,
               "libcellml::Units::compatible(u2, u1)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x75c,local_a0[0]);
    testing::internal::AssertHelper::operator=(local_a8,(Message *)local_b0);
    testing::internal::AssertHelper::~AssertHelper(local_a8);
    std::__cxx11::string::~string((string *)local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_b0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&import.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Units, isCompatibleBaseUnitImported)
{
    libcellml::ModelPtr model = libcellml::Model::create();
    model->setName("model");

    libcellml::UnitsPtr u = libcellml::Units::create();
    u->setName("u");
    u->addUnit("apples", 0, 1.0, 1.0);

    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");
    u1->addUnit(libcellml::Units::StandardUnit::RADIAN, 0, 1.0, 1.0);

    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");
    u2->addUnit(libcellml::Units::StandardUnit::RADIAN, 0, 1.0, 1.0);
    u2->addUnit("u", 0, 1.0, 1.0);

    model->addUnits(u);
    model->addUnits(u1);
    model->addUnits(u2);

    libcellml::ImportSourcePtr import = libcellml::ImportSource::create();
    import->setUrl("I_am_a_url");

    u->setImportSource(import);

    EXPECT_TRUE(u->isImport());
    EXPECT_FALSE(libcellml::Units::compatible(u1, u2));
    EXPECT_FALSE(libcellml::Units::compatible(u2, u1));
}